

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O1

void textui_browse_knowledge(void)

{
  _Bool _Var1;
  wchar_t wVar2;
  size_t i;
  wchar_t wVar3;
  long lVar4;
  region_conflict knowledge_region;
  region local_30;
  
  wVar2 = max_runes();
  local_30.col = 0;
  local_30.row = 0;
  local_30.width = -1;
  local_30.page_rows = main_knowledge_menu.count + L'\x02';
  if (main_knowledge_menu.irune < main_knowledge_menu.count) {
    wVar3 = L'\x01';
    if (L'\0' < wVar2) {
      i = 0;
      do {
        _Var1 = player_knows_rune(player,i);
        if ((_Var1) || ((player->opts).opt[0x1a] == true)) {
          wVar3 = L'\0';
          break;
        }
        i = i + 1;
      } while ((uint)wVar2 != i);
    }
    main_knowledge_menu.actions[main_knowledge_menu.irune].flags = wVar3;
  }
  if (main_knowledge_menu.iartifact < main_knowledge_menu.count) {
    wVar2 = collect_known_artifacts((int *)0x0,0);
    main_knowledge_menu.actions[main_knowledge_menu.iartifact].flags = (uint)(wVar2 < L'\x01');
  }
  wVar2 = main_knowledge_menu.count;
  if (main_knowledge_menu.iego < main_knowledge_menu.count) {
    wVar3 = L'\x01';
    if ((ulong)z_info->e_max != 0) {
      lVar4 = 0;
      do {
        if (((&e_info->everseen)[lVar4] != false) || ((player->opts).opt[0x1a] == true)) {
          wVar3 = L'\0';
          break;
        }
        lVar4 = lVar4 + 0x260;
      } while ((ulong)z_info->e_max * 0x260 - lVar4 != 0);
    }
    main_knowledge_menu.actions[main_knowledge_menu.iego].flags = wVar3;
  }
  if (main_knowledge_menu.imonster < wVar2) {
    wVar2 = count_known_monsters();
    main_knowledge_menu.actions[main_knowledge_menu.imonster].flags = (uint)(wVar2 < L'\x01');
  }
  lVar4 = (long)main_knowledge_menu.ishape;
  if (main_knowledge_menu.ishape < main_knowledge_menu.count) {
    wVar2 = count_interesting_shapes();
    main_knowledge_menu.actions[lVar4].flags = (uint)(wVar2 < L'\x01');
  }
  screen_save();
  menu_layout((menu *)&main_knowledge_menu.m,&local_30);
  clear_from(L'\0');
  menu_select((menu *)&main_knowledge_menu.m,0,false);
  screen_load();
  return;
}

Assistant:

void textui_browse_knowledge(void)
{
	int i, flag, rune_max = max_runes();
	region knowledge_region = { 0, 0, -1, 2 + main_knowledge_menu.count };

	/* Runes */
	if (main_knowledge_menu.irune < main_knowledge_menu.count) {
		flag = MN_ACT_GRAYED;
		for (i = 0; i < rune_max; i++) {
			if (player_knows_rune(player, i)
					|| OPT(player, cheat_xtra)) {
				flag = 0;
				break;
			}
		}
		main_knowledge_menu.actions[main_knowledge_menu.irune].flags =
			flag;
	}
		
	/* Artifacts */
	if (main_knowledge_menu.iartifact < main_knowledge_menu.count) {
		main_knowledge_menu.actions[main_knowledge_menu.iartifact].flags =
			(collect_known_artifacts(NULL, 0) > 0) ?
			0 : MN_ACT_GRAYED;
	}

	/* Ego items */
	if (main_knowledge_menu.iego < main_knowledge_menu.count) {
		flag = MN_ACT_GRAYED;
		for (i = 0; i < z_info->e_max; i++) {
			if (e_info[i].everseen || OPT(player, cheat_xtra)) {
				flag = 0;
				break;
			}
		}
		main_knowledge_menu.actions[main_knowledge_menu.iego].flags = flag;
	}

	/* Monsters */
	if (main_knowledge_menu.imonster < main_knowledge_menu.count) {
		main_knowledge_menu.actions[main_knowledge_menu.imonster].flags =
			(count_known_monsters() > 0) ? 0 : MN_ACT_GRAYED;
	}

	/* Shapechanges */
	if (main_knowledge_menu.ishape < main_knowledge_menu.count) {
		main_knowledge_menu.actions[main_knowledge_menu.ishape].flags =
			(count_interesting_shapes() > 0) ? 0 : MN_ACT_GRAYED;
	}

	screen_save();
	menu_layout(&main_knowledge_menu.m, &knowledge_region);

	clear_from(0);
	menu_select(&main_knowledge_menu.m, 0, false);

	screen_load();
}